

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int NV12ToRGB565Matrix(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,
                      uint8_t *dst_rgb565,int dst_stride_rgb565,YuvConstants *yuvconstants,int width
                      ,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *NV12ToRGB565Row;
  int y;
  code *pcVar2;
  uint local_38;
  int local_34;
  long local_30;
  long local_20;
  long local_10;
  int local_4;
  
  pcVar2 = NV12ToRGB565Row_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) || ((y < 1 || ((int)dst_rgb565 == 0)))) {
    local_4 = -1;
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    if ((int)dst_rgb565 < 0) {
      dst_rgb565._0_4_ = -(int)dst_rgb565;
      local_30 = in_R8 + ((int)dst_rgb565 + -1) * in_R9D;
      local_34 = -in_R9D;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = NV12ToRGB565Row_Any_SSSE3, (y & 7U) == 0)) {
      pcVar2 = NV12ToRGB565Row_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = NV12ToRGB565Row_Any_AVX2, (y & 0xfU) == 0)) {
      pcVar2 = NV12ToRGB565Row_AVX2;
    }
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; (int)local_38 < (int)dst_rgb565; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,local_30,NV12ToRGB565Row,y);
      local_30 = local_30 + local_34;
      local_10 = local_10 + in_ESI;
      if ((local_38 & 1) != 0) {
        local_20 = local_20 + in_ECX;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int NV12ToRGB565Matrix(const uint8_t* src_y,
                       int src_stride_y,
                       const uint8_t* src_uv,
                       int src_stride_uv,
                       uint8_t* dst_rgb565,
                       int dst_stride_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width,
                       int height) {
  int y;
  void (*NV12ToRGB565Row)(
      const uint8_t* y_buf, const uint8_t* uv_buf, uint8_t* rgb_buf,
      const struct YuvConstants* yuvconstants, int width) = NV12ToRGB565Row_C;
  if (!src_y || !src_uv || !dst_rgb565 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb565 = dst_rgb565 + (height - 1) * dst_stride_rgb565;
    dst_stride_rgb565 = -dst_stride_rgb565;
  }
#if defined(HAS_NV12TORGB565ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB565Row = NV12ToRGB565Row_SSSE3;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      NV12ToRGB565Row = NV12ToRGB565Row_AVX2;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB565Row = NV12ToRGB565Row_NEON;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      NV12ToRGB565Row = NV12ToRGB565Row_MMI;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB565Row = NV12ToRGB565Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    NV12ToRGB565Row(src_y, src_uv, dst_rgb565, yuvconstants, width);
    dst_rgb565 += dst_stride_rgb565;
    src_y += src_stride_y;
    if (y & 1) {
      src_uv += src_stride_uv;
    }
  }
  return 0;
}